

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

string * __thiscall
cmCTestRunTest::GetTestPrefix_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestRunTest *this,size_t completed,size_t total)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  ostringstream outputStream;
  ostringstream indexStr;
  string asStack_338 [32];
  undefined1 local_318 [376];
  ostream local_1a0;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_318);
  iVar1 = getNumWidth(total);
  *(long *)(*(_func_int **)(local_318._0_8_ + -0x18) + (long)(local_318 + 0x10)) = (long)iVar1;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_318);
  std::operator<<(poVar2,"/");
  iVar1 = getNumWidth(total);
  *(long *)(*(_func_int **)(local_318._0_8_ + -0x18) + (long)(local_318 + 0x10)) = (long)iVar1;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_318);
  std::operator<<(poVar2," ");
  pcVar3 = "Test";
  if (this->TestHandler->MemCheck != false) {
    pcVar3 = "MemCheck";
  }
  std::operator<<((ostream *)local_318,pcVar3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  poVar2 = std::operator<<(&local_1a0," #");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->Index);
  std::operator<<(poVar2,":");
  iVar1 = getNumWidth((long)this->TestHandler->MaxIndex);
  *(long *)(*(_func_int **)(local_318._0_8_ + -0x18) + (long)(local_318 + 0x10)) = (long)(iVar1 + 3)
  ;
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)local_318,asStack_338);
  std::__cxx11::string::~string(asStack_338);
  std::operator<<((ostream *)local_318," ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_318);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestRunTest::GetTestPrefix(size_t completed, size_t total) const
{
  std::ostringstream outputStream;
  outputStream << std::setw(getNumWidth(total)) << completed << "/";
  outputStream << std::setw(getNumWidth(total)) << total << " ";

  if (this->TestHandler->MemCheck) {
    outputStream << "MemCheck";
  } else {
    outputStream << "Test";
  }

  std::ostringstream indexStr;
  indexStr << " #" << this->Index << ":";
  outputStream << std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
               << indexStr.str();
  outputStream << " ";

  return outputStream.str();
}